

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::Array<unsigned_char>_>::setCapacity
          (Vector<kj::Array<unsigned_char>_> *this,size_t newSize)

{
  Array<unsigned_char> *pAVar1;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar2;
  ulong uVar3;
  Array<unsigned_char> *pAVar4;
  __off_t in_RDX;
  ArrayBuilder<kj::Array<unsigned_char>_> newBuilder;
  ArrayBuilder<kj::Array<unsigned_char>_> local_38;
  
  uVar3 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * -0x5555555555555555;
  if (newSize <= uVar3 && uVar3 - newSize != 0) {
    ArrayBuilder<kj::Array<unsigned_char>_>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Array<unsigned_char> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pAVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pAVar4 = (this->builder).ptr; pAVar4 != pAVar1; pAVar4 = pAVar4 + 1) {
    (local_38.pos)->ptr = pAVar4->ptr;
    (local_38.pos)->size_ = pAVar4->size_;
    (local_38.pos)->disposer = pAVar4->disposer;
    local_38.pos = local_38.pos + 1;
    pAVar4->ptr = (uchar *)0x0;
    pAVar4->size_ = 0;
  }
  ArrayBuilder<kj::Array<unsigned_char>_>::operator=(&this->builder,&local_38);
  pAVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pAVar4 = local_38.ptr;
  if (local_38.ptr != (Array<unsigned_char> *)0x0) {
    local_38.ptr = (Array<unsigned_char> *)0x0;
    local_38.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
    local_38.endPtr = (Array<unsigned_char> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pAVar4,0x18,
               ((long)pRVar2 - (long)pAVar4 >> 3) * -0x5555555555555555,
               ((long)pAVar1 - (long)pAVar4 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<unsigned_char>,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }